

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void fread_to_eol(FILE *fp)

{
  uint uVar1;
  int iVar2;
  
  do {
    uVar1 = getc((FILE *)fp);
    if ((char)uVar1 == '\r') break;
  } while ((uVar1 & 0xff) != 10);
  do {
    do {
      iVar2 = getc((FILE *)fp);
      iVar2 = iVar2 << 0x18;
    } while (iVar2 == 0xa000000);
  } while (iVar2 == 0xd000000);
  ungetc(iVar2 >> 0x18,(FILE *)fp);
  return;
}

Assistant:

void fread_to_eol(FILE *fp)
{
	char c;

	do
	{
		c = getc(fp);
	} while (c != '\n' && c != '\r');

	do
	{
		c = getc(fp);
	} while (c == '\n' || c == '\r');

	ungetc(c, fp);
}